

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::GetInlineeCodeGenRuntimeData(FunctionBody *this,ProfileId profiledCallSiteId)

{
  code *pcVar1;
  bool bVar2;
  FunctionCodeGenRuntimeData *in_RAX;
  undefined4 *puVar3;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar4;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_28;
  
  local_28.ptr = in_RAX;
  if (this->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1a32,"(profiledCallSiteId < profiledCallSiteCount)",
                                "profiledCallSiteId < profiledCallSiteCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pWVar4 = FunctionProxy::
           GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)11,Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>*>
                     ((FunctionProxy *)this);
  if (pWVar4 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    local_28.ptr = (FunctionCodeGenRuntimeData *)0x0;
  }
  else {
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
              (&local_28,pWVar4 + profiledCallSiteId);
  }
  return local_28.ptr;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionBody::GetInlineeCodeGenRuntimeData(const ProfileId profiledCallSiteId) const
    {
        Assert(profiledCallSiteId < profiledCallSiteCount);

        auto codeGenRuntimeData = this->GetCodeGenRuntimeDataWithLock();
        return codeGenRuntimeData ? codeGenRuntimeData[profiledCallSiteId] : nullptr;
    }